

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkUpgradeToStruct
          (CompatibilityChecker *this,Reader *type,uint64_t structTypeId,
          Maybe<capnp::schema::Node::Reader> *matchSize,
          Maybe<capnp::schema::Field::Reader> *matchPosition)

{
  Impl *this_00;
  Reader value_00;
  bool bVar1;
  Which WVar2;
  uint16_t uVar3;
  uint32_t value_01;
  Reader *this_01;
  Maybe<capnp::schema::Field::Reader> *params_2;
  Reader local_5f8;
  Builder local_5c8;
  Builder local_5a8;
  Builder local_590;
  Orphan<capnp::Data> local_578;
  Orphan<capnp::Text> local_558;
  undefined1 local_530 [8];
  Builder value;
  Reader local_4e0;
  undefined1 local_4b0 [8];
  Reader matchSlot;
  Builder local_478;
  Reader local_450;
  Builder local_420;
  Reader local_3f8;
  Reader *local_3c8;
  Reader *p;
  Reader *_p1101;
  CapTableReader *pCStack_3b0;
  void *local_3a8;
  WirePointer *pWStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined1 local_388 [8];
  Builder slot;
  Builder local_350;
  undefined1 local_328 [8];
  Builder field;
  Reader match;
  Reader *s;
  Reader *_s1089;
  Builder structNode;
  ArrayPtr<const_char> local_280 [2];
  undefined1 local_260 [8];
  Builder node;
  undefined1 local_228 [8];
  MallocMessageBuilder builder;
  word scratch [32];
  Maybe<capnp::schema::Field::Reader> *matchPosition_local;
  Maybe<capnp::schema::Node::Reader> *matchSize_local;
  uint64_t structTypeId_local;
  Reader *type_local;
  CompatibilityChecker *this_local;
  
  builder.moreSegments.builder.disposer = (ArrayDisposer *)0x0;
  params_2 = matchPosition;
  kj::ArrayPtr<capnp::word>::ArrayPtr<32ul>
            ((ArrayPtr<capnp::word> *)&node._builder.dataSize,
             (word (*) [32])&builder.moreSegments.builder.disposer);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_228,stack0xfffffffffffffdc8,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::schema::Node>((Builder *)local_260,(MessageBuilder *)local_228);
  capnp::schema::Node::Builder::setId((Builder *)local_260,structTypeId);
  kj::str<char_const(&)[23],capnp::Text::Reader&,char_const(&)[2]>
            ((String *)&structNode._builder.dataSize,(kj *)"(unknown type used in ",
             (char (*) [23])&this->nodeName,(Reader *)0x3a5081,(char (*) [2])params_2);
  Text::Reader::Reader((Reader *)local_280,(String *)&structNode._builder.dataSize);
  capnp::schema::Node::Builder::setDisplayName((Builder *)local_260,(Reader)local_280[0]);
  kj::String::~String((String *)&structNode._builder.dataSize);
  capnp::schema::Node::Builder::initStruct((Builder *)&_s1089,(Builder *)local_260);
  WVar2 = capnp::schema::Type::Reader::which(type);
  switch(WVar2) {
  case VOID:
    capnp::schema::Node::Struct::Builder::setDataWordCount((Builder *)&_s1089,0);
    capnp::schema::Node::Struct::Builder::setPointerCount((Builder *)&_s1089,0);
    break;
  case BOOL:
    capnp::schema::Node::Struct::Builder::setDataWordCount((Builder *)&_s1089,1);
    capnp::schema::Node::Struct::Builder::setPointerCount((Builder *)&_s1089,0);
    break;
  case INT8:
  case UINT8:
    capnp::schema::Node::Struct::Builder::setDataWordCount((Builder *)&_s1089,1);
    capnp::schema::Node::Struct::Builder::setPointerCount((Builder *)&_s1089,0);
    break;
  case INT16:
  case UINT16:
  case ENUM:
    capnp::schema::Node::Struct::Builder::setDataWordCount((Builder *)&_s1089,1);
    capnp::schema::Node::Struct::Builder::setPointerCount((Builder *)&_s1089,0);
    break;
  case INT32:
  case UINT32:
  case FLOAT32:
    capnp::schema::Node::Struct::Builder::setDataWordCount((Builder *)&_s1089,1);
    capnp::schema::Node::Struct::Builder::setPointerCount((Builder *)&_s1089,0);
    break;
  case INT64:
  case UINT64:
  case FLOAT64:
    capnp::schema::Node::Struct::Builder::setDataWordCount((Builder *)&_s1089,1);
    capnp::schema::Node::Struct::Builder::setPointerCount((Builder *)&_s1089,0);
    break;
  case TEXT:
  case DATA:
  case LIST:
  case STRUCT:
  case INTERFACE:
  case ANY_POINTER:
    capnp::schema::Node::Struct::Builder::setDataWordCount((Builder *)&_s1089,0);
    capnp::schema::Node::Struct::Builder::setPointerCount((Builder *)&_s1089,1);
  }
  this_01 = kj::_::readMaybe<capnp::schema::Node::Reader>(matchSize);
  if (this_01 != (Reader *)0x0) {
    capnp::schema::Node::Reader::getStruct((Reader *)&field._builder.dataSize,this_01);
    uVar3 = capnp::schema::Node::Struct::Reader::getDataWordCount
                      ((Reader *)&field._builder.dataSize);
    capnp::schema::Node::Struct::Builder::setDataWordCount((Builder *)&_s1089,uVar3);
    uVar3 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)&field._builder.dataSize)
    ;
    capnp::schema::Node::Struct::Builder::setPointerCount((Builder *)&_s1089,uVar3);
  }
  capnp::schema::Node::Struct::Builder::initFields(&local_350,(Builder *)&_s1089,1);
  List<capnp::schema::Field,_(capnp::Kind)3>::Builder::operator[]((Builder *)local_328,&local_350,0)
  ;
  Text::Reader::Reader((Reader *)&slot._builder.dataSize,"member0");
  capnp::schema::Field::Builder::setName((Builder *)local_328,(Reader)stack0xfffffffffffffca0);
  capnp::schema::Field::Builder::setCodeOrder((Builder *)local_328,0);
  capnp::schema::Field::Builder::initSlot((Builder *)local_388,(Builder *)local_328);
  _p1101 = (Reader *)(type->_reader).segment;
  pCStack_3b0 = (type->_reader).capTable;
  local_3a8 = (type->_reader).data;
  pWStack_3a0 = (type->_reader).pointers;
  local_398._0_4_ = (type->_reader).dataSize;
  local_398._4_2_ = (type->_reader).pointerCount;
  local_398._6_2_ = *(undefined2 *)&(type->_reader).field_0x26;
  uStack_390 = *(undefined8 *)&(type->_reader).nestingLimit;
  capnp::schema::Field::Slot::Builder::setType((Builder *)local_388,(Reader)type->_reader);
  p = kj::_::readMaybe<capnp::schema::Field::Reader>(matchPosition);
  if (p == (Reader *)0x0) {
    capnp::schema::Field::Builder::getOrdinal
              ((Builder *)&value._builder.dataSize,(Builder *)local_328);
    capnp::schema::Field::Ordinal::Builder::setExplicit((Builder *)&value._builder.dataSize,0);
    capnp::schema::Field::Slot::Builder::setOffset((Builder *)local_388,0);
    capnp::schema::Field::Slot::Builder::initDefaultValue((Builder *)local_530,(Builder *)local_388)
    ;
    WVar2 = capnp::schema::Type::Reader::which(type);
    switch(WVar2) {
    case VOID:
      capnp::schema::Value::Builder::setVoid((Builder *)local_530);
      break;
    case BOOL:
      capnp::schema::Value::Builder::setBool((Builder *)local_530,false);
      break;
    case INT8:
      capnp::schema::Value::Builder::setInt8((Builder *)local_530,'\0');
      break;
    case INT16:
      capnp::schema::Value::Builder::setInt16((Builder *)local_530,0);
      break;
    case INT32:
      capnp::schema::Value::Builder::setInt32((Builder *)local_530,0);
      break;
    case INT64:
      capnp::schema::Value::Builder::setInt64((Builder *)local_530,0);
      break;
    case UINT8:
      capnp::schema::Value::Builder::setUint8((Builder *)local_530,'\0');
      break;
    case UINT16:
      capnp::schema::Value::Builder::setUint16((Builder *)local_530,0);
      break;
    case UINT32:
      capnp::schema::Value::Builder::setUint32((Builder *)local_530,0);
      break;
    case UINT64:
      capnp::schema::Value::Builder::setUint64((Builder *)local_530,0);
      break;
    case FLOAT32:
      capnp::schema::Value::Builder::setFloat32((Builder *)local_530,0.0);
      break;
    case FLOAT64:
      capnp::schema::Value::Builder::setFloat64((Builder *)local_530,0.0);
      break;
    case TEXT:
      local_558.builder.capTable = (CapTableBuilder *)0x0;
      local_558.builder.location = (word *)0x0;
      local_558.builder.tag.content = 0;
      local_558.builder.segment = (SegmentBuilder *)0x0;
      Orphan<capnp::Text>::Orphan(&local_558);
      capnp::schema::Value::Builder::adoptText((Builder *)local_530,&local_558);
      Orphan<capnp::Text>::~Orphan(&local_558);
      break;
    case DATA:
      local_578.builder.capTable = (CapTableBuilder *)0x0;
      local_578.builder.location = (word *)0x0;
      local_578.builder.tag.content = 0;
      local_578.builder.segment = (SegmentBuilder *)0x0;
      Orphan<capnp::Data>::Orphan(&local_578);
      capnp::schema::Value::Builder::adoptData((Builder *)local_530,&local_578);
      Orphan<capnp::Data>::~Orphan(&local_578);
      break;
    case LIST:
      capnp::schema::Value::Builder::initList(&local_590,(Builder *)local_530);
      break;
    case ENUM:
      capnp::schema::Value::Builder::setEnum((Builder *)local_530,0);
      break;
    case STRUCT:
      capnp::schema::Value::Builder::initStruct(&local_5a8,(Builder *)local_530);
      break;
    case INTERFACE:
      capnp::schema::Value::Builder::setInterface((Builder *)local_530);
      break;
    case ANY_POINTER:
      capnp::schema::Value::Builder::initAnyPointer(&local_5c8,(Builder *)local_530);
    }
  }
  else {
    local_3c8 = p;
    capnp::schema::Field::Reader::getOrdinal(&local_3f8,p);
    bVar1 = capnp::schema::Field::Ordinal::Reader::isExplicit(&local_3f8);
    if (bVar1) {
      capnp::schema::Field::Builder::getOrdinal(&local_420,(Builder *)local_328);
      capnp::schema::Field::Reader::getOrdinal(&local_450,local_3c8);
      uVar3 = capnp::schema::Field::Ordinal::Reader::getExplicit(&local_450);
      capnp::schema::Field::Ordinal::Builder::setExplicit(&local_420,uVar3);
    }
    else {
      capnp::schema::Field::Builder::getOrdinal(&local_478,(Builder *)local_328);
      capnp::schema::Field::Ordinal::Builder::setImplicit(&local_478);
    }
    capnp::schema::Field::Reader::getSlot((Reader *)local_4b0,local_3c8);
    value_01 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_4b0);
    capnp::schema::Field::Slot::Builder::setOffset((Builder *)local_388,value_01);
    capnp::schema::Field::Slot::Reader::getDefaultValue(&local_4e0,(Reader *)local_4b0);
    value_00._reader.capTable = local_4e0._reader.capTable;
    value_00._reader.segment = local_4e0._reader.segment;
    value_00._reader.data = local_4e0._reader.data;
    value_00._reader.pointers = local_4e0._reader.pointers;
    value_00._reader.dataSize = local_4e0._reader.dataSize;
    value_00._reader.pointerCount = local_4e0._reader.pointerCount;
    value_00._reader._38_2_ = local_4e0._reader._38_2_;
    value_00._reader.nestingLimit = local_4e0._reader.nestingLimit;
    value_00._reader._44_4_ = local_4e0._reader._44_4_;
    capnp::schema::Field::Slot::Builder::setDefaultValue((Builder *)local_388,value_00);
  }
  this_00 = this->loader;
  capnp::schema::Node::Builder::operator_cast_to_Reader(&local_5f8,(Builder *)local_260);
  SchemaLoader::Impl::load(this_00,&local_5f8,true);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_228);
  return;
}

Assistant:

void checkUpgradeToStruct(const schema::Type::Reader& type, uint64_t structTypeId,
                            kj::Maybe<schema::Node::Reader> matchSize = kj::none,
                            kj::Maybe<schema::Field::Reader> matchPosition = kj::none) {
    // We can't just look up the target struct and check it because it may not have been loaded
    // yet.  Instead, we contrive a struct that looks like what we want and load() that, which
    // guarantees that any incompatibility will be caught either now or when the real version of
    // that struct is loaded.

    word scratch[32];
    memset(scratch, 0, sizeof(scratch));
    MallocMessageBuilder builder(scratch);
    auto node = builder.initRoot<schema::Node>();
    node.setId(structTypeId);
    node.setDisplayName(kj::str("(unknown type used in ", nodeName, ")"));
    auto structNode = node.initStruct();

    switch (type.which()) {
      case schema::Type::VOID:
        structNode.setDataWordCount(0);
        structNode.setPointerCount(0);
        break;

      case schema::Type::BOOL:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT8:
      case schema::Type::UINT8:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT16:
      case schema::Type::UINT16:
      case schema::Type::ENUM:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT32:
      case schema::Type::UINT32:
      case schema::Type::FLOAT32:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT64:
      case schema::Type::UINT64:
      case schema::Type::FLOAT64:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::LIST:
      case schema::Type::STRUCT:
      case schema::Type::INTERFACE:
      case schema::Type::ANY_POINTER:
        structNode.setDataWordCount(0);
        structNode.setPointerCount(1);
        break;
    }

    KJ_IF_SOME(s, matchSize) {
      auto match = s.getStruct();
      structNode.setDataWordCount(match.getDataWordCount());
      structNode.setPointerCount(match.getPointerCount());
    }

    auto field = structNode.initFields(1)[0];
    field.setName("member0");
    field.setCodeOrder(0);
    auto slot = field.initSlot();
    slot.setType(type);

    KJ_IF_SOME(p, matchPosition) {
      if (p.getOrdinal().isExplicit()) {
        field.getOrdinal().setExplicit(p.getOrdinal().getExplicit());
      } else {
        field.getOrdinal().setImplicit();
      }
      auto matchSlot = p.getSlot();
      slot.setOffset(matchSlot.getOffset());
      slot.setDefaultValue(matchSlot.getDefaultValue());
    } else {
      field.getOrdinal().setExplicit(0);
      slot.setOffset(0);

      schema::Value::Builder value = slot.initDefaultValue();
      switch (type.which()) {
        case schema::Type::VOID: value.setVoid(); break;
        case schema::Type::BOOL: value.setBool(false); break;
        case schema::Type::INT8: value.setInt8(0); break;
        case schema::Type::INT16: value.setInt16(0); break;
        case schema::Type::INT32: value.setInt32(0); break;
        case schema::Type::INT64: value.setInt64(0); break;
        case schema::Type::UINT8: value.setUint8(0); break;
        case schema::Type::UINT16: value.setUint16(0); break;
        case schema::Type::UINT32: value.setUint32(0); break;
        case schema::Type::UINT64: value.setUint64(0); break;
        case schema::Type::FLOAT32: value.setFloat32(0); break;
        case schema::Type::FLOAT64: value.setFloat64(0); break;
        case schema::Type::ENUM: value.setEnum(0); break;
        case schema::Type::TEXT: value.adoptText(Orphan<Text>()); break;
        case schema::Type::DATA: value.adoptData(Orphan<Data>()); break;
        case schema::Type::LIST: value.initList(); break;
        case schema::Type::STRUCT: value.initStruct(); break;
        case schema::Type::INTERFACE: value.setInterface(); break;
        case schema::Type::ANY_POINTER: value.initAnyPointer(); break;
      }
    }